

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning.cpp
# Opt level: O0

void get_spanning_tree(void)

{
  pointer *pppVar1;
  pointer *this;
  int v_00;
  int v_01;
  pair<int,_std::pair<int,_int>_> pVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference ppVar12;
  ostream *poVar13;
  reference rVar14;
  pair<int,_std::pair<int,_int>_> pVar15;
  pair<int,_std::pair<int,_int>_> *result;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  *__range1;
  int w;
  int v;
  int u;
  int i_3;
  int i_2;
  pair<int,_std::pair<int,_int>_> *local_d0;
  reference local_c8;
  reference local_b8;
  pair<int,_std::pair<int,_int>_> local_a8;
  pair<int,_int> local_98;
  pair<int,_std::pair<int,_int>_> local_90;
  reference local_80;
  int local_70;
  int local_6c;
  int cur_v;
  int j;
  int i_1;
  bool local_55;
  int local_54;
  undefined1 local_50 [4];
  int i;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  used;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  results;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  edges_weights;
  
  freopen("spanning.txt","w",_stdout);
  std::
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
            *)&results.
               super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
            *)&used.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)local_50);
  local_54 = 0;
  while( true ) {
    pVar2.second.second = local_90.second.second;
    pVar2.first = local_90.first;
    pVar2.second.first = local_90.second.first;
    pVar15.second.second = local_a8.second.second;
    pVar15.first = local_a8.first;
    pVar15.second.first = local_a8.second.first;
    if (V <= local_54) break;
    local_55 = false;
    std::
    vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
    ::emplace_back<int&,bool>
              ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                *)local_50,&V,&local_55);
    local_54 = local_54 + 1;
  }
  local_a8 = pVar15;
  local_90 = pVar2;
  for (cur_v = 0; cur_v < V; cur_v = cur_v + 1) {
    local_6c = 0;
    while( true ) {
      uVar6 = (ulong)local_6c;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)cur_v);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      if (sVar8 <= uVar6) break;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)cur_v);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_6c);
      local_70 = *pvVar9;
      pvVar10 = std::
                vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              *)local_50,(long)cur_v);
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar10,(long)local_70);
      local_80 = rVar14;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_80);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&weight,(long)cur_v);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_6c);
        local_98 = std::make_pair<int&,int&>(&cur_v,&local_70);
        pVar15 = std::make_pair<int&,std::pair<int,int>>(pvVar9,&local_98);
        local_a8 = pVar15;
        local_90 = pVar15;
        std::
        vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
        ::push_back((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                     *)&results.
                        super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_90);
        pvVar10 = std::
                  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                *)local_50,(long)cur_v);
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar10,(long)local_70);
        local_b8 = rVar14;
        std::_Bit_reference::operator=(&local_b8,true);
        pvVar10 = std::
                  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                *)local_50,(long)local_70);
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar10,(long)cur_v);
        local_c8 = rVar14;
        std::_Bit_reference::operator=(&local_c8,true);
      }
      local_6c = local_6c + 1;
    }
  }
  pppVar1 = &results.
             super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0 = (pair<int,_std::pair<int,_int>_> *)
             std::
             vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             ::begin((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                      *)pppVar1);
  _i_2 = std::
         vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
         ::end((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                *)pppVar1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,std::pair<int,int>>*,std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>>,std::greater<std::pair<int,std::pair<int,int>>>>
            (local_d0,_i_2);
  for (u = 0; u < V; u = u + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::p,&u);
  }
  for (v = 0; v < E; v = v + 1) {
    pppVar1 = &results.
               super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar11 = std::
              vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
              ::operator[]((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                            *)pppVar1,(long)v);
    v_00 = (pvVar11->second).first;
    pvVar11 = std::
              vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
              ::operator[]((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                            *)pppVar1,(long)v);
    v_01 = (pvVar11->second).second;
    std::
    vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
    ::operator[]((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                  *)pppVar1,(long)v);
    iVar4 = dsu_get(v_00);
    iVar5 = dsu_get(v_01);
    if (iVar4 != iVar5) {
      pvVar11 = std::
                vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                              *)&results.
                                 super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)v);
      std::
      vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ::push_back((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                   *)&used.
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
      dsu_unite(v_00,v_01);
    }
  }
  this = &used.
          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
           ::begin((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                    *)this);
  result = (pair<int,_std::pair<int,_int>_> *)
           std::
           vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
           ::end((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                  *)this);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
                                *)&result);
    if (!bVar3) break;
    ppVar12 = __gnu_cxx::
              __normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
              ::operator*(&__end1);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&id,(long)(ppVar12->second).first);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
    poVar13 = std::operator<<(poVar13," ");
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&id,(long)(ppVar12->second).second);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pvVar9);
    poVar13 = std::operator<<(poVar13," ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,ppVar12->first);
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_std::pair<int,_int>_>_*,_std::vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)local_50);
  std::
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::~vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             *)&used.
                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::~vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             *)&results.
                super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void get_spanning_tree() {
    freopen("spanning.txt", "w", stdout); // output file

    vector < pair < int, pair<int, int> > > edges_weights, results;

    vector < vector<bool> > used;
    for (int i = 0; i < V; i++) {
        used.emplace_back(V, false);
    }

    for (int i = 0; i < V; i++) {
        for (int j = 0; j < edge[i].size(); j++) {
            int cur_v = edge[i][j];
            if (!used[i][cur_v]) {
                edges_weights.push_back(make_pair(weight[i][j], make_pair(i, cur_v)));
                used[i][cur_v] = true;
                used[cur_v][i] = true;
            }
        }
    }

    sort(edges_weights.begin(), edges_weights.end(), greater< pair < int, pair<int, int> > >());

    for (int i = 0; i < V; i++) {
        p.push_back(i);
    }

    for (int i = 0; i < E; i++) {
        int u = edges_weights[i].second.first;
        int v = edges_weights[i].second.second;
        int w = edges_weights[i].first;
        (void)w;

        if (dsu_get(u) != dsu_get(v)) {
            results.push_back(edges_weights[i]);
            dsu_unite(u, v);
        }
    }

    for (const auto& result : results) {
        cout << id[result.second.first] << " " << id[result.second.second] << " " << result.first << endl;
    }
}